

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall
TTD::ThreadContextTTD::AddNewScriptContext_Helper
          (ThreadContextTTD *this,ScriptContext *ctx,
          HostScriptContextCallbackFunctor *callbackFunctor,bool noNative,bool debugMode)

{
  int iVar1;
  Type ppSVar2;
  FinalizableObject *pFVar3;
  void *pvVar4;
  JsTTDOnScriptLoadCallback p_Var5;
  JsTTDOnBPRegisterCallback p_Var6;
  JsTTDOnBPClearDocumentCallback p_Var7;
  ulong uVar8;
  ulong uVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  
  pFVar3 = callbackFunctor->HostContext;
  pvVar4 = callbackFunctor->HostRuntime;
  p_Var5 = callbackFunctor->pfOnScriptLoadCallback;
  p_Var6 = callbackFunctor->pfOnBPRegisterCallback;
  p_Var7 = callbackFunctor->pfOnBPClearDocumentCallback;
  (ctx->TTDHostCallbackFunctor).pfOnBPDeleteCallback = callbackFunctor->pfOnBPDeleteCallback;
  (ctx->TTDHostCallbackFunctor).pfOnBPClearDocumentCallback = p_Var7;
  (ctx->TTDHostCallbackFunctor).pfOnScriptLoadCallback = p_Var5;
  (ctx->TTDHostCallbackFunctor).pfOnBPRegisterCallback = p_Var6;
  (ctx->TTDHostCallbackFunctor).HostContext = pFVar3;
  (ctx->TTDHostCallbackFunctor).HostRuntime = pvVar4;
  if ((int)CONCAT71(in_register_00000009,noNative) != 0) {
    (ctx->config).NoNative = true;
  }
  if (debugMode) {
    Js::ScriptContext::GetDebugContext(ctx);
  }
  Js::ScriptContext::InitializeCoreImage_TTD(ctx);
  uVar9 = (ulong)(this->m_contextList).
                 super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.
                 count;
  if (0 < (long)uVar9) {
    ppSVar2 = (this->m_contextList).
              super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.buffer
    ;
    if (*ppSVar2 != ctx) {
      uVar8 = 1;
      do {
        uVar10 = uVar8;
        if (uVar9 == uVar10) break;
        uVar8 = uVar10 + 1;
      } while (ppSVar2[uVar10] != ctx);
      if (uVar9 <= uVar10) goto LAB_008f3181;
    }
    TTDAbort_unrecoverable_error("We should only be adding at creation time!!!");
  }
LAB_008f3181:
  JsUtil::
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(&this->m_contextList,0);
  iVar1 = (this->m_contextList).
          super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.count;
  (this->m_contextList).
  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.buffer[iVar1] =
       ctx;
  (this->m_contextList).
  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.count = iVar1 + 1;
  return;
}

Assistant:

void ThreadContextTTD::AddNewScriptContext_Helper(Js::ScriptContext* ctx, HostScriptContextCallbackFunctor& callbackFunctor, bool noNative, bool debugMode)
    {
        ////
        //First just setup the standard things needed for a script context
        ctx->TTDHostCallbackFunctor = callbackFunctor;
        if(noNative)
        {
            ctx->ForceNoNative();
        }

        if(debugMode)
        {
#ifdef _WIN32
            ctx->InitializeDebugging();
#else
            //
            //TODO: x-plat does not like some parts of initiallize debugging so just set the flag we need
            //
            ctx->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
#endif
        }

        ctx->InitializeCoreImage_TTD();

        TTDAssert(!this->m_contextList.Contains(ctx), "We should only be adding at creation time!!!");
        this->m_contextList.Add(ctx);
    }